

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

int ReconstructUV(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  uint8_t *puVar1;
  DError *paaiVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VP8Matrix *pVVar6;
  uint16_t *puVar7;
  VP8Matrix **ppVVar8;
  uint uVar10;
  ulong uVar11;
  undefined8 uVar12;
  int16_t *piVar13;
  long lVar14;
  uint8_t *puVar15;
  int16_t (*paiVar16) [16];
  int16_t tmp [8] [16];
  VP8Matrix *local_178;
  VP8Encoder *local_170;
  VP8EncIterator *local_168;
  VP8SegmentInfo *local_160;
  uint8_t *local_158;
  uint8_t *local_150;
  DError *local_148;
  int8_t (*local_140) [3];
  int16_t local_138 [132];
  VP8Matrix **ppVVar9;
  
  ppVVar8 = &local_178;
  ppVVar9 = &local_178;
  puVar1 = it->yuv_in;
  local_170 = it->enc;
  puVar15 = it->yuv_p + VP8UVModeOffsets[mode];
  local_178 = (VP8Matrix *)(ulong)(*(byte *)it->mb >> 5 & 3);
  uVar11 = 0xfffffffffffffffe;
  piVar13 = local_138;
  puVar7 = VP8ScanUV;
  local_168 = it;
  local_150 = yuv_out;
  do {
    (*VP8FTransform2)(puVar1 + (ulong)*puVar7 + 0x10,puVar15 + *puVar7,piVar13);
    uVar11 = uVar11 + 2;
    piVar13 = piVar13 + 0x20;
    puVar7 = puVar7 + 2;
  } while (uVar11 < 6);
  local_160 = local_170->dqm + (long)local_178;
  local_158 = puVar15;
  if (local_168->top_derr != (DError *)0x0) {
    pVVar6 = &local_170->dqm[(long)local_178].uv;
    local_140 = rd->derr;
    uVar12 = CONCAT71((int7)((ulong)local_140 >> 8),1);
    lVar14 = 0;
    local_148 = local_168->top_derr + local_168->x;
    local_178 = pVVar6;
    do {
      paaiVar2 = local_148;
      local_170 = (VP8Encoder *)CONCAT44(local_170._4_4_,(int)uVar12);
      piVar13 = local_138 + lVar14 * 0x40;
      *piVar13 = *piVar13 +
                 (short)((uint)(int)(short)((*local_148)[lVar14][0] * 7 +
                                           local_168->left_derr[lVar14][0] * 8) >> 3);
      iVar3 = QuantizeSingle(piVar13,pVVar6);
      piVar13 = local_138 + lVar14 * 0x40 + 0x10;
      *piVar13 = *piVar13 + (short)((uint)((*paaiVar2)[lVar14][1] * 7) >> 3) + (short)iVar3;
      iVar4 = QuantizeSingle(piVar13,pVVar6);
      piVar13 = local_138 + lVar14 * 0x40 + 0x20;
      *piVar13 = *piVar13 + (short)((uint)(iVar3 * 7) >> 3) + (short)local_168->left_derr[lVar14][1]
      ;
      iVar3 = QuantizeSingle(piVar13,pVVar6);
      piVar13 = local_138 + lVar14 * 0x40 + 0x30;
      *piVar13 = *piVar13 + (short)((uint)(iVar4 * 7) >> 3) + (short)iVar3;
      iVar5 = QuantizeSingle(piVar13,pVVar6);
      local_140[lVar14][0] = (int8_t)iVar4;
      local_140[lVar14][1] = (int8_t)iVar3;
      local_140[lVar14][2] = (int8_t)iVar5;
      lVar14 = 1;
      uVar12 = 0;
    } while (((ulong)local_170 & 1) != 0);
  }
  paiVar16 = rd->uv_levels;
  pVVar6 = &local_160->uv;
  uVar10 = 0;
  uVar11 = 0xfffffffffffffffe;
  do {
    ppVVar8 = (VP8Matrix **)((long)ppVVar8 + 0x40);
    iVar3 = (*VP8EncQuantize2Blocks)((int16_t *)ppVVar8,*paiVar16,pVVar6);
    puVar15 = local_150;
    puVar1 = local_158;
    uVar11 = uVar11 + 2;
    uVar10 = uVar10 | iVar3 << ((byte)uVar11 & 0x1f);
    paiVar16 = paiVar16 + 2;
  } while (uVar11 < 6);
  uVar11 = 0xfffffffffffffffe;
  puVar7 = VP8ScanUV;
  do {
    ppVVar9 = (VP8Matrix **)((long)ppVVar9 + 0x40);
    (*VP8ITransform)(puVar1 + *puVar7,(int16_t *)ppVVar9,puVar15 + *puVar7,1);
    uVar11 = uVar11 + 2;
    puVar7 = puVar7 + 2;
  } while (uVar11 < 6);
  return uVar10 << 0x10;
}

Assistant:

static int ReconstructUV(VP8EncIterator* WEBP_RESTRICT const it,
                         VP8ModeScore* WEBP_RESTRICT const rd,
                         uint8_t* WEBP_RESTRICT const yuv_out, int mode) {
  const VP8Encoder* const enc = it->enc;
  const uint8_t* const ref = it->yuv_p + VP8UVModeOffsets[mode];
  const uint8_t* const src = it->yuv_in + U_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm[it->mb->segment];
  int nz = 0;
  int n;
  int16_t tmp[8][16];

  for (n = 0; n < 8; n += 2) {
    VP8FTransform2(src + VP8ScanUV[n], ref + VP8ScanUV[n], tmp[n]);
  }
  if (it->top_derr != NULL) CorrectDCValues(it, &dqm->uv, tmp, rd);

  if (DO_TRELLIS_UV && it->do_trellis) {
    int ch, x, y;
    for (ch = 0, n = 0; ch <= 2; ch += 2) {
      for (y = 0; y < 2; ++y) {
        for (x = 0; x < 2; ++x, ++n) {
          const int ctx = it->top_nz[4 + ch + x] + it->left_nz[4 + ch + y];
          const int non_zero = TrellisQuantizeBlock(
              enc, tmp[n], rd->uv_levels[n], ctx, TYPE_CHROMA_A, &dqm->uv,
              dqm->lambda_trellis_uv);
          it->top_nz[4 + ch + x] = it->left_nz[4 + ch + y] = non_zero;
          nz |= non_zero << n;
        }
      }
    }
  } else {
    for (n = 0; n < 8; n += 2) {
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->uv_levels[n], &dqm->uv) << n;
    }
  }

  for (n = 0; n < 8; n += 2) {
    VP8ITransform(ref + VP8ScanUV[n], tmp[n], yuv_out + VP8ScanUV[n], 1);
  }
  return (nz << 16);
}